

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O0

void __thiscall
Refal2::CLeftPartCompiler::CompileLeftPart
          (CLeftPartCompiler *this,CUnitList *leftPart,bool isRightDirection)

{
  bool bVar1;
  CNodeType *pCVar2;
  CNodeType *pCVar3;
  CNodeType *pCVar4;
  CNode<Refal2::CHole> *pCVar5;
  CHole local_40;
  byte local_19;
  CUnitList *pCStack_18;
  bool isRightDirection_local;
  CUnitList *leftPart_local;
  CLeftPartCompiler *this_local;
  
  this->top = 2;
  local_19 = isRightDirection;
  pCStack_18 = leftPart;
  leftPart_local = (CUnitList *)this;
  CHole::CHole(&local_40,leftPart,0,1);
  CNodeList<Refal2::CHole>::Append(&this->holes,&local_40);
  CHole::~CHole(&local_40);
  pCVar2 = CNodeList<Refal2::CHole>::GetFirst(&this->holes);
  this->lastUsedHole = pCVar2;
LAB_00151cf6:
  pCVar2 = CNodeList<Refal2::CHole>::GetFirst(&this->holes);
  this->hole = pCVar2;
LAB_00151d0e:
  do {
    if (this->hole == (CHoleNode *)0x0) break;
    pCVar3 = CNodeList<Refal2::CUnit>::GetFirst((CNodeList<Refal2::CUnit> *)this->hole);
    pCVar4 = CNodeList<Refal2::CUnit>::GetLast((CNodeList<Refal2::CUnit> *)this->hole);
    if (pCVar3 != pCVar4) {
      pCVar3 = CNodeList<Refal2::CUnit>::GetFirst((CNodeList<Refal2::CUnit> *)this->hole);
      bVar1 = isFreeVE(this,pCVar3);
      if (bVar1) {
        pCVar3 = CNodeList<Refal2::CUnit>::GetLast((CNodeList<Refal2::CUnit> *)this->hole);
        bVar1 = isFreeVE(this,pCVar3);
        if (bVar1) {
          pCVar5 = CNode<Refal2::CHole>::Next(this->hole);
          this->hole = pCVar5;
          goto LAB_00151d0e;
        }
      }
    }
    matchElement(this);
    pCVar2 = CNodeList<Refal2::CHole>::GetFirst(&this->holes);
    this->hole = pCVar2;
  } while( true );
  bVar1 = CNodeList<Refal2::CHole>::IsEmpty(&this->holes);
  if (bVar1) {
    if (this->maxTableSize < this->top) {
      this->maxTableSize = this->top;
    }
    return;
  }
  pCVar2 = CNodeList<Refal2::CHole>::GetFirst(&this->holes);
  this->hole = pCVar2;
  matchVE(this,(bool)(local_19 & 1));
  goto LAB_00151cf6;
}

Assistant:

void CLeftPartCompiler::CompileLeftPart( CUnitList& leftPart,
	bool isRightDirection )
{
	top = 2;
	holes.Append( CHole( leftPart, 0 /* left */, 1 /* right */ ) );
	lastUsedHole = holes.GetFirst();

	while( true ) {
		hole = holes.GetFirst();

		while( hole != 0 ) {
			if( hole->GetFirst() != hole->GetLast()
				&& isFreeVE( hole->GetFirst() ) && isFreeVE( hole->GetLast() ) )
			{
				hole = hole->Next();
			} else {
				matchElement();
				hole = holes.GetFirst();
			}
		}

		if( holes.IsEmpty() ) {
			break;
		} else {
			hole = holes.GetFirst();
			matchVE( isRightDirection );
		}
	}

	if( top > maxTableSize ) {
		maxTableSize = top;
	}
}